

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O2

void bloaty::wasm::AddWebAssemblyFallback(RangeSink *sink)

{
  string_view file_range;
  size_t in_R8;
  string_view sVar1;
  string_view name;
  string_view name_00;
  allocator<char> local_12a;
  allocator<char> local_129;
  string_view local_128;
  string name2;
  undefined1 local_f8 [40];
  size_t local_d0;
  char *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_128._M_len = (sink->file_->data_)._M_len;
  local_128._M_str = (sink->file_->data_)._M_str;
  ReadMagic(&local_128);
  while (local_128._M_len != 0) {
    Section::Read((Section *)local_f8,&local_128);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"[section ",&local_129);
    std::__cxx11::string::string((string *)&local_90,(string *)(local_f8 + 8));
    std::operator+(&local_50,&local_70,&local_90);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"]",&local_12a);
    std::operator+(&name2,&local_50,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    file_range._M_str = local_c8;
    file_range._M_len = local_d0;
    name._M_str = name2._M_dataplus._M_p;
    name._M_len = name2._M_string_length;
    in_R8 = local_d0;
    RangeSink::AddFileRange(sink,"wasm_overhead",name,file_range);
    std::__cxx11::string::~string((string *)&name2);
    std::__cxx11::string::~string((string *)(local_f8 + 8));
  }
  sVar1._M_str = (char *)0x0;
  sVar1._M_len = (size_t)(sink->file_->data_)._M_str;
  sVar1 = StrictSubstr((bloaty *)(sink->file_->data_)._M_len,sVar1,8,in_R8);
  name_00._M_str = "[WASM Header]";
  name_00._M_len = 0xd;
  RangeSink::AddFileRange(sink,"wasm_overhead",name_00,sVar1);
  return;
}

Assistant:

void AddWebAssemblyFallback(RangeSink* sink) {
  ForEachSection(sink->input_file().data(), [sink](const Section& section) {
    std::string name2 =
        std::string("[section ") + std::string(section.name) + std::string("]");
    sink->AddFileRange("wasm_overhead", name2, section.data);
  });
  sink->AddFileRange("wasm_overhead", "[WASM Header]",
                     StrictSubstr(sink->input_file().data(), 0, 8));
}